

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O0

int __thiscall Js::TypePath::AddInternal<false>(TypePath *this,PropertyRecord *propId)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  Data *this_00;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar7;
  RecyclerWeakReference<Js::DynamicObject> *this_01;
  PropertyRecord *this_02;
  char16 *pcVar8;
  DynamicObject *local_38;
  ushort local_1e;
  PropertyIndex i;
  int propertyIndex;
  PropertyRecord *propId_local;
  TypePath *this_local;
  
  this_00 = GetData(this);
  iVar6 = Data::Add<false>(this_00,propId,(Type *)(this + 1));
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FixMethodPropsPhase);
  if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
    ppRVar7 = Memory::PointerValue<Memory::RecyclerWeakReference<Js::DynamicObject>>
                        (&this->singletonInstance);
    pRVar1 = *ppRVar7;
    ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                        ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar7 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_38 = (DynamicObject *)0x0;
    }
    else {
      this_01 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      local_38 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_01);
    }
    Output::Print(L"FixedFields: TypePath::AddInternal: singleton = 0x%p(0x%p)\n",pRVar1,local_38);
    Output::Print(L"   fixed fields:");
    for (local_1e = 0; bVar3 = GetPathLength(this), local_1e < bVar3; local_1e = local_1e + 1) {
      this_02 = GetPropertyId(this,(uint)local_1e);
      pcVar8 = PropertyRecord::GetBuffer(this_02);
      bVar3 = GetMaxInitializedLength(this);
      bVar4 = GetPathLength(this);
      bVar2 = GetIsFixedFieldAt(this,local_1e,(uint)bVar4);
      bVar4 = GetPathLength(this);
      bVar5 = GetIsUsedFixedFieldAt(this,local_1e,(uint)bVar4);
      Output::Print(L" %s %d%d%d,",pcVar8,(ulong)(local_1e < bVar3),(ulong)bVar2,(ulong)bVar5);
    }
    Output::Print(L"\n");
  }
  return iVar6;
}

Assistant:

int AddInternal(const PropertyRecord * propId)
    {
        int propertyIndex = this->GetData()->Add<addNewId>(propId, assignments);

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: TypePath::AddInternal: singleton = 0x%p(0x%p)\n"),
                PointerValue(this->singletonInstance), this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));

            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetPropertyId(i)->GetBuffer(),
                    i < GetMaxInitializedLength() ? 1 : 0,
                    GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }

            Output::Print(_u("\n"));
        }
#endif

        return propertyIndex;
    }